

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfilingHelpers.cpp
# Opt level: O3

Var Js::ProfilingHelpers::ProfiledLdSuperFld_Jit
              (Var instance,PropertyId propertyId,InlineCacheIndex inlineCacheIndex,
              void *framePointer,Var thisInstance)

{
  JavascriptCallStackLayout *pJVar1;
  ScriptFunction *scriptFunction;
  InlineCache *inlineCache;
  FunctionBody *functionBody;
  Var pvVar2;
  
  pJVar1 = JavascriptCallStackLayout::FromFramePointer(framePointer);
  scriptFunction =
       UnsafeVarTo<Js::ScriptFunction,Js::JavascriptFunction>(*(JavascriptFunction **)pJVar1);
  inlineCache = GetInlineCache(scriptFunction,inlineCacheIndex);
  functionBody = JavascriptFunction::GetFunctionBody((JavascriptFunction *)scriptFunction);
  pvVar2 = ProfiledLdFld<false,false,false>
                     (instance,propertyId,inlineCache,inlineCacheIndex,functionBody,thisInstance);
  return pvVar2;
}

Assistant:

Var ProfilingHelpers::ProfiledLdSuperFld_Jit(
        const Var instance,
        const PropertyId propertyId,
        const InlineCacheIndex inlineCacheIndex,
        void *const framePointer,
        const Var thisInstance)
    {
        JIT_HELPER_REENTRANT_HEADER(ProfiledLdSuperFld);
        ScriptFunction *const scriptFunction =
            UnsafeVarTo<ScriptFunction>(JavascriptCallStackLayout::FromFramePointer(framePointer)->functionObject);
        return
            ProfiledLdFld<false, false, false>(
            instance,
            propertyId,
            GetInlineCache(scriptFunction, inlineCacheIndex),
            inlineCacheIndex,
            scriptFunction->GetFunctionBody(),
            thisInstance);
        JIT_HELPER_END(ProfiledLdSuperFld);
    }